

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgm_overlay.cpp
# Opt level: O1

MatchResult __thiscall r_exec::PGMOverlay::match(PGMOverlay *this,View *input,uint16_t *input_index)

{
  atomic_int_fast64_t *paVar1;
  list<unsigned_short> *this_00;
  pointer pPVar2;
  _Object *p_Var3;
  bool bVar4;
  MatchResult MVar5;
  byte bVar6;
  long c;
  P<r_code::View> local_40;
  uint16_t *local_38;
  
  if (input != (View *)0x0) {
    LOCK();
    paVar1 = &(input->super_View).super__Object.refCount;
    (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
    UNLOCK();
  }
  local_40.object = (_Object *)input;
  local_38 = input_index;
  std::vector<core::P<r_code::View>,std::allocator<core::P<r_code::View>>>::
  emplace_back<core::P<r_code::View>>
            ((vector<core::P<r_code::View>,std::allocator<core::P<r_code::View>>> *)
             &this->input_views,&local_40);
  if ((View *)local_40.object != (View *)0x0) {
    LOCK();
    ((local_40.object)->refCount).super___atomic_base<long>._M_i =
         ((local_40.object)->refCount).super___atomic_base<long>._M_i + -1;
    UNLOCK();
    if (((local_40.object)->refCount).super___atomic_base<long>._M_i < 1) {
      (*(((View *)&(local_40.object)->_vptr__Object)->super__Object)._vptr__Object[1])();
    }
  }
  c = (this->input_pattern_indices).used_cells_head;
  if (c == -1) {
    MVar5 = IMPOSSIBLE;
  }
  else {
    this_00 = &this->input_pattern_indices;
    bVar6 = 0;
    do {
      MVar5 = _match(this,input,
                     (this->input_pattern_indices).cells.
                     super__Vector_base<r_code::list<unsigned_short>::cell,_std::allocator<r_code::list<unsigned_short>::cell>_>
                     ._M_impl.super__Vector_impl_data._M_start[c].data);
      if (MVar5 == SUCCESS) {
        *local_38 = (this_00->cells).
                    super__Vector_base<r_code::list<unsigned_short>::cell,_std::allocator<r_code::list<unsigned_short>::cell>_>
                    ._M_impl.super__Vector_impl_data._M_start[c].data;
        r_code::list<unsigned_short>::__erase(this_00,c);
        bVar4 = false;
      }
      else {
        bVar4 = true;
        if (MVar5 == FAILURE) {
          Overlay::rollback((Overlay *)this);
          bVar6 = 1;
          bVar4 = true;
        }
      }
      if (!bVar4) {
        return SUCCESS;
      }
      c = (this_00->cells).
          super__Vector_base<r_code::list<unsigned_short>::cell,_std::allocator<r_code::list<unsigned_short>::cell>_>
          ._M_impl.super__Vector_impl_data._M_start[c].next;
    } while (c != -1);
    MVar5 = ((byte)~bVar6 & 1) * 2 + FAILURE;
  }
  pPVar2 = (this->input_views).
           super__Vector_base<core::P<r_code::View>,_std::allocator<core::P<r_code::View>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  (this->input_views).
  super__Vector_base<core::P<r_code::View>,_std::allocator<core::P<r_code::View>_>_>._M_impl.
  super__Vector_impl_data._M_finish = pPVar2 + -1;
  p_Var3 = pPVar2[-1].object;
  if (p_Var3 != (_Object *)0x0) {
    LOCK();
    (p_Var3->refCount).super___atomic_base<long>._M_i =
         (p_Var3->refCount).super___atomic_base<long>._M_i + -1;
    UNLOCK();
    if ((p_Var3->refCount).super___atomic_base<long>._M_i < 1) {
      (*p_Var3->_vptr__Object[1])();
    }
  }
  return MVar5;
}

Assistant:

PGMOverlay::MatchResult PGMOverlay::match(r_exec::View *input, uint16_t &input_index)
{
    input_views.push_back(input);
    bool failed = false;
    r_code::list<uint16_t>::const_iterator it;

    for (it = input_pattern_indices.begin(); it != input_pattern_indices.end(); ++it) {
        MatchResult r = _match(input, *it);

        switch (r) {
        case SUCCESS:
            input_index = *it;
            input_pattern_indices.erase(it);
            return r;

        case FAILURE:
            failed = true;
            rollback(); // to try another pattern on a clean basis.

        case IMPOSSIBLE:
            break;
        }
    }

    input_views.pop_back();
    return failed ? FAILURE : IMPOSSIBLE;
}